

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

void __thiscall toml::internal::Parser::addError(Parser *this,string *reason)

{
  ostream *poVar1;
  stringstream ss;
  string asStack_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  if ((this->errorReason_)._M_string_length == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"Error: line ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->lexer_).lineNo_);
    poVar1 = std::operator<<(poVar1,": ");
    std::operator<<(poVar1,(string *)reason);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&this->errorReason_,asStack_1b8);
    std::__cxx11::string::~string(asStack_1b8);
    std::__cxx11::stringstream::~stringstream(local_198);
  }
  return;
}

Assistant:

inline const char* Value::typeToString(Value::Type type)
{
    switch (type) {
    case NULL_TYPE:   return "null";
    case BOOL_TYPE:   return "bool";
    case INT_TYPE:    return "int";
    case DOUBLE_TYPE: return "double";
    case STRING_TYPE: return "string";
    case TIME_TYPE:   return "time";
    case ARRAY_TYPE:  return "array";
    case TABLE_TYPE:  return "table";
    default:          return "unknown";
    }
}